

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O2

void __thiscall QPDFArgParser::parseArgs(QPDFArgParser *this)

{
  option_table_t *poVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
  *p_Var2;
  bool bVar3;
  bool bVar4;
  element_type *peVar5;
  long lVar6;
  size_type sVar7;
  char *pcVar8;
  size_type sVar9;
  logic_error *this_00;
  _Rb_tree_node_base *p_Var10;
  int iVar11;
  element_type *extraout_RDX;
  iterator unaff_R14;
  undefined1 uVar12;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string parameter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string arg_s;
  string o_arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  selectMainOptionTable(this);
  checkCompletion(this);
  handleArgFileArguments(this);
  peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar5->cur_arg = 1;
  iVar11 = 1;
  do {
    if (peVar5->argc <= iVar11) {
      if (peVar5->bash_completion == true) goto LAB_00150b29;
      doFinalChecks(this);
      return;
    }
    poVar1 = peVar5->option_table;
    pcVar8 = peVar5->argv[iVar11];
    parameter._M_dataplus._M_p = (pointer)&parameter.field_2;
    parameter._M_string_length = 0;
    parameter.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&o_arg,pcVar8,(allocator<char> *)&arg_s);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg_s,pcVar8,(allocator<char> *)&message);
    if (*pcVar8 == '-') {
      if ((pcVar8[1] == '-') && (pcVar8[2] == '\0')) {
        p_Var2 = &((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->option_table->_M_t;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&message,"--",(allocator<char> *)&local_110);
        unaff_R14 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                    ::find(p_Var2,&message);
        std::__cxx11::string::~string((string *)&message);
        if ((_Rb_tree_header *)unaff_R14._M_node ==
            &(((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->option_table->_M_t)._M_impl.super__Rb_tree_header) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_00,"QPDFArgParser: -- handler not registered");
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        bVar4 = true;
        goto LAB_00150712;
      }
      if (pcVar8[1] == '\0') goto LAB_001506cf;
      std::__cxx11::string::assign((char *)&arg_s);
      if ((arg_s._M_string_length == 0) ||
         (lVar6 = std::__cxx11::string::find((char)&arg_s,0x3d), lVar6 == -1)) {
        uVar12 = _S_red;
      }
      else {
        std::__cxx11::string::substr((ulong)&message,(ulong)&arg_s);
        std::__cxx11::string::operator=((string *)&parameter,(string *)&message);
        std::__cxx11::string::~string((string *)&message);
        std::__cxx11::string::substr((ulong)&message,(ulong)&arg_s);
        std::__cxx11::string::operator=((string *)&arg_s,(string *)&message);
        std::__cxx11::string::~string((string *)&message);
        uVar12 = _S_black;
      }
      peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((((peVar5->bash_completion != false) || (peVar5->argc != 2)) || (peVar5->cur_arg != 1)) ||
         (sVar7 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                  ::count(&peVar5->help_option_table,&arg_s), sVar7 == 0)) {
        unaff_R14._M_node = &(poVar1->_M_t)._M_impl.super__Rb_tree_header._M_header;
        if ((arg_s._M_string_length != 0) &&
           (pcVar8 = (char *)std::__cxx11::string::at((ulong)&arg_s), *pcVar8 != '-')) {
          unaff_R14 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                      ::find(&((this->m).
                               super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->option_table->_M_t,&arg_s);
        }
        bVar4 = false;
        goto LAB_00150794;
      }
      unaff_R14 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                  ::find(&(((this->m).
                            super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->help_option_table)._M_t,&arg_s);
      bVar3 = true;
      bVar4 = false;
    }
    else {
LAB_001506cf:
      p_Var2 = &((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->option_table->_M_t;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&message,"",(allocator<char> *)&local_110);
      unaff_R14 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                  ::find(p_Var2,&message);
      std::__cxx11::string::~string((string *)&message);
      std::__cxx11::string::assign((char *)&parameter);
      bVar4 = false;
LAB_00150712:
      uVar12 = _S_red;
LAB_00150794:
      bVar3 = false;
    }
    if ((_Rb_tree_header *)unaff_R14._M_node ==
        &(((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->option_table->_M_t)._M_impl.super__Rb_tree_header) {
      std::operator+(&message,"unrecognized argument ",&o_arg);
      peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (peVar5->option_table != &peVar5->main_option_table) {
LAB_00150a71:
        std::operator+(&local_d0," (",&peVar5->option_table_name);
        std::operator+(&local_110,&local_d0," options must be terminated with --)");
        std::__cxx11::string::append((string *)&message);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      usage(this,&message);
LAB_001509e6:
      exit(0);
    }
    if (((undefined1)((char)unaff_R14._M_node[2]._M_color ^ _S_black | uVar12) != _S_black) ||
       ((uVar12 == _S_black && unaff_R14._M_node[4]._M_left != (_Base_ptr)0x0 &&
        (sVar9 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&unaff_R14._M_node[3]._M_parent,&parameter), sVar9 == 0)))) {
      std::operator+(&local_b0,"--",&arg_s);
      std::operator+(&local_d0,&local_b0," must be given as --");
      std::operator+(&local_110,&local_d0,&arg_s);
      std::operator+(&message,&local_110,"=");
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      if (unaff_R14._M_node[7]._M_parent == (_Base_ptr)0x0) {
        if (unaff_R14._M_node[4]._M_left != (_Base_ptr)0x0) goto LAB_00150b31;
        if (unaff_R14._M_node[2]._M_left != (_Base_ptr)0x0) {
          unaff_R14._M_node = (_Base_ptr)&unaff_R14._M_node[2]._M_parent;
          std::__cxx11::string::append((string *)&message);
LAB_00150b1c:
          do {
            usage(this,&message);
LAB_00150b29:
            handleCompletion(this);
LAB_00150b31:
            std::__cxx11::string::append((char *)&message);
            p_Var10 = *(_Rb_tree_node_base **)(unaff_R14._M_node + 4);
            unaff_R14._M_node = (_Base_ptr)&unaff_R14._M_node[3]._M_left;
            bVar4 = true;
            while (p_Var10 != unaff_R14._M_node) {
              if (!bVar4) {
                std::__cxx11::string::append((char *)&message);
              }
              std::__cxx11::string::append((string *)&message);
              p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
              bVar4 = false;
            }
            std::__cxx11::string::append((char *)&message);
          } while( true );
        }
      }
      else {
        unaff_R14._M_node = (_Base_ptr)&unaff_R14._M_node[6]._M_right;
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)unaff_R14._M_node,&parameter);
      }
      std::__cxx11::string::append((char *)&message);
      goto LAB_00150b1c;
    }
    if (unaff_R14._M_node[5]._M_parent == (_Base_ptr)0x0) {
      if (unaff_R14._M_node[6]._M_parent != (_Base_ptr)0x0) {
        unaff_R14._M_node = (_Base_ptr)&unaff_R14._M_node[5]._M_right;
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)unaff_R14._M_node,&parameter);
      }
    }
    else {
      if (uVar12 != _S_red) {
        s_abi_cxx11_(&local_50,"--",2);
        std::operator+(&local_b0,&local_50,&arg_s);
        std::operator+(&local_d0,&local_b0," does not take a parameter, but \"");
        std::operator+(&local_110,&local_d0,&parameter);
        std::operator+(&message,&local_110,"\" was given");
        usage(this,&message);
        peVar5 = extraout_RDX;
        goto LAB_00150a71;
      }
      unaff_R14._M_node = (_Base_ptr)&unaff_R14._M_node[4]._M_right;
      std::function<void_()>::operator()((function<void_()> *)unaff_R14._M_node);
    }
    if (bVar3) goto LAB_001509e6;
    if (bVar4) {
      selectMainOptionTable(this);
    }
    std::__cxx11::string::~string((string *)&arg_s);
    std::__cxx11::string::~string((string *)&o_arg);
    std::__cxx11::string::~string((string *)&parameter);
    peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    iVar11 = peVar5->cur_arg + 1;
    peVar5->cur_arg = iVar11;
  } while( true );
}

Assistant:

void
QPDFArgParser::parseArgs()
{
    selectMainOptionTable();
    checkCompletion();
    handleArgFileArguments();
    for (m->cur_arg = 1; m->cur_arg < m->argc; ++m->cur_arg) {
        bool help_option = false;
        bool end_option = false;
        auto oep = m->option_table->end();
        char const* arg = m->argv[m->cur_arg];
        std::string parameter;
        bool have_parameter = false;
        std::string o_arg(arg);
        std::string arg_s(arg);
        if (strcmp(arg, "--") == 0) {
            // Special case for -- option, which is used to break out of subparsers.
            oep = m->option_table->find("--");
            end_option = true;
            if (oep == m->option_table->end()) {
                // This is registered automatically, so this can't happen.
                throw std::logic_error("QPDFArgParser: -- handler not registered");
            }
        } else if ((arg[0] == '-') && (strcmp(arg, "-") != 0)) {
            ++arg;
            if (arg[0] == '-') {
                // Be lax about -arg vs --arg
                ++arg;
            } else {
                QTC::TC("libtests", "QPDFArgParser single dash");
            }

            // Prevent --=something from being treated as an empty arg by searching for = from after
            // the first character. We do this since the empty string in the option table is for
            // positional arguments. Besides, it doesn't make sense to have an empty option.
            arg_s = arg;
            size_t equal_pos = std::string::npos;
            if (arg_s.length() > 0) {
                equal_pos = arg_s.find('=', 1);
            }
            if (equal_pos != std::string::npos) {
                have_parameter = true;
                parameter = arg_s.substr(equal_pos + 1);
                arg_s = arg_s.substr(0, equal_pos);
            }

            if ((!m->bash_completion) && (m->argc == 2) && (m->cur_arg == 1) &&
                m->help_option_table.count(arg_s)) {
                // Handle help option, which is only valid as the sole option.
                QTC::TC("libtests", "QPDFArgParser help option");
                oep = m->help_option_table.find(arg_s);
                help_option = true;
            }

            if (!(help_option || arg_s.empty() || (arg_s.at(0) == '-'))) {
                oep = m->option_table->find(arg_s);
            }
        } else {
            // The empty string maps to the positional argument handler.
            QTC::TC("libtests", "QPDFArgParser positional");
            oep = m->option_table->find("");
            parameter = arg;
        }

        if (oep == m->option_table->end()) {
            QTC::TC("libtests", "QPDFArgParser unrecognized");
            std::string message = "unrecognized argument " + o_arg;
            if (m->option_table != &m->main_option_table) {
                message += " (" + m->option_table_name + " options must be terminated with --)";
            }
            usage(message);
        }

        OptionEntry& oe = oep->second;
        if ((oe.parameter_needed && (!have_parameter)) ||
            ((!oe.choices.empty() && have_parameter && (0 == oe.choices.count(parameter))))) {
            std::string message = "--" + arg_s + " must be given as --" + arg_s + "=";
            if (oe.invalid_choice_handler) {
                oe.invalid_choice_handler(parameter);
                // Method should call usage() or exit. Just in case it doesn't...
                message += "option";
            } else if (!oe.choices.empty()) {
                QTC::TC("libtests", "QPDFArgParser required choices");
                message += "{";
                bool first = true;
                for (auto const& choice: oe.choices) {
                    if (first) {
                        first = false;
                    } else {
                        message += ",";
                    }
                    message += choice;
                }
                message += "}";
            } else if (!oe.parameter_name.empty()) {
                QTC::TC("libtests", "QPDFArgParser required parameter");
                message += oe.parameter_name;
            } else {
                // should not be possible
                message += "option";
            }
            usage(message);
        }

        if (oe.bare_arg_handler) {
            if (have_parameter) {
                usage(
                    "--"s + arg_s + " does not take a parameter, but \"" + parameter +
                    "\" was given");
            }
            oe.bare_arg_handler();
        } else if (oe.param_arg_handler) {
            oe.param_arg_handler(parameter);
        }
        if (help_option) {
            exit(0);
        }
        if (end_option) {
            selectMainOptionTable();
        }
    }
    if (m->bash_completion) {
        handleCompletion();
    } else {
        doFinalChecks();
    }
}